

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

bool __thiscall gl4cts::TextureViewTestViewSampling::executeTest(TextureViewTestViewSampling *this)

{
  float *pfVar1;
  ostringstream *this_00;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  undefined4 extraout_var;
  void *pvVar10;
  long lVar11;
  uchar *puVar12;
  TestError *this_01;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int *piVar18;
  bool bVar19;
  uint n_sample;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  GLuint n_sample_00;
  float fVar23;
  uint local_1e4;
  uint local_1d0;
  Vec4 reference_color;
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar9 + 8))(0x84c0);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1151);
  (**(code **)(lVar9 + 0xb8))(this->m_iteration_view_texture_target,this->m_view_to_id);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1154);
  (**(code **)(lVar9 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1158);
  (**(code **)(lVar9 + 0x1680))(this->m_po_id);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x115c);
  (**(code **)(lVar9 + 0x78))(0x8d40,this->m_fbo_id);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1161);
  (**(code **)(lVar9 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_result_to_id,0);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glFramebufferTexture2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1164);
  pvVar10 = operator_new__((ulong)this->m_iteration_parent_texture_n_samples << 6);
  uVar20 = (ulong)this->m_iteration_view_texture_minlayer;
  GVar2 = this->m_iteration_view_texture_target;
  bVar19 = true;
  this_00 = (ostringstream *)(reference_color.m_data + 2);
  uVar21 = uVar20;
  do {
    uVar22 = this->m_iteration_view_texture_numlayers;
    uVar13 = (ulong)uVar22;
    iVar6 = (int)uVar21;
    uVar14 = (uint)uVar20;
    if ((uVar22 + iVar6 <= uVar14) || (bVar19 == false)) {
      operator_delete__(pvVar10);
      return bVar19;
    }
    if (GVar2 == 0x9009) {
LAB_00aa8aaa:
      local_1e4 = (uint)(uVar20 / 6);
      local_1d0 = (uint)(uVar20 % 6);
      uVar20 = (ulong)(uVar14 - iVar6) / 6;
      uVar15 = (ulong)(uVar14 - iVar6) % 6;
      uVar17 = uVar15;
    }
    else {
      local_1d0 = 0;
      uVar15 = uVar20;
      uVar17 = 0;
      local_1e4 = uVar14;
      if (GVar2 == 0x8513) goto LAB_00aa8aaa;
    }
    if (this->m_po_z_float_location != -1) {
      if ((GVar2 == 0x8513) || (GVar2 == 0x9009)) {
        fVar23 = 0.0;
        if (6 < uVar22) goto LAB_00aa8afd;
      }
      else {
        fVar23 = 0.0;
        if (1 < uVar22) {
LAB_00aa8afd:
          if ((GVar2 == 0x9009) || (GVar2 == 0x8513)) {
            uVar22 = uVar22 / 6;
            uVar15 = uVar13 % 6;
          }
          else {
            uVar20 = (ulong)(uint)((int)uVar20 - iVar6);
          }
          fVar23 = (float)uVar20 / (float)(uVar22 - 1);
        }
      }
      (**(code **)(lVar9 + 0x14e0))(fVar23,this->m_po_z_float_location,uVar21,uVar15);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glUniform1f() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11a9);
    }
    if (this->m_po_z_int_location != -1) {
      (**(code **)(lVar9 + 0x14f0))
                (this->m_po_z_int_location,uVar14 - this->m_iteration_view_texture_minlayer);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glUniform1i() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11b1);
    }
    if (this->m_po_n_face_location != -1) {
      (**(code **)(lVar9 + 0x14f0))(this->m_po_n_face_location,uVar17);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glUniform1i() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11b7);
    }
    GVar8 = this->m_iteration_view_texture_minlevel;
    n_sample_00 = GVar8;
    while ((n_sample_00 < this->m_iteration_view_texture_numlevels + GVar8 && (bVar19 != false))) {
      if (this->m_po_lod_location != -1) {
        (**(code **)(lVar9 + 0x14e0))((float)(n_sample_00 - GVar8));
        dVar7 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar7,"glUniform1i() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x11c3);
      }
      uVar22 = 0;
      for (uVar20 = 0; uVar20 < this->m_iteration_parent_texture_n_samples; uVar20 = uVar20 + 1) {
        getReferenceColor((TextureViewTestViewSampling *)&reference_color,(uint)this,local_1e4,
                          local_1d0,n_sample_00);
        pfVar1 = (float *)((long)pvVar10 + (ulong)uVar22 * 4);
        *pfVar1 = reference_color.m_data[0];
        pfVar1[1] = reference_color.m_data[1];
        pfVar1[2] = reference_color.m_data[2];
        pfVar1[3] = reference_color.m_data[3];
        uVar22 = uVar22 + 4;
      }
      (**(code **)(lVar9 + 0x15a8))
                (this->m_po_reference_colors_location,
                 (ulong)this->m_iteration_parent_texture_n_samples,pvVar10);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glUniform4fv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11d3);
      (**(code **)(lVar9 + 0xb8))(this->m_iteration_view_texture_target,this->m_view_to_id);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11d7);
      (**(code **)(lVar9 + 0x30))(4);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glBeginTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11de);
      (**(code **)(lVar9 + 0x538))(0xe,0,1);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11e1);
      (**(code **)(lVar9 + 0x638))();
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glEndTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11e4);
      lVar11 = (**(code **)(lVar9 + 0xcf8))(0x8c8e,35000);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glMapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11ee);
      if (lVar11 == 0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"glMapBuffer() call succeeded but the pointer returned is NULL",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x11f1);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      piVar18 = (int *)(lVar11 + 0xc);
      uVar20 = 0;
      while ((uVar20 < 6 && (bVar19 != false))) {
        iVar6 = piVar18[-2];
        iVar3 = piVar18[-1];
        iVar4 = *piVar18;
        if (piVar18[-3] != 1) {
          reference_color.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(reference_color.m_data + 2));
          std::operator<<((ostream *)(reference_color.m_data + 2),
                          "Invalid data was sampled in vertex shader stage.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&reference_color,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(reference_color.m_data + 2))
          ;
          bVar19 = false;
        }
        if (iVar6 != 1) {
          reference_color.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(reference_color.m_data + 2));
          std::operator<<((ostream *)(reference_color.m_data + 2),
                          "Invalid data was sampled in tessellation control shader stage.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&reference_color,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(reference_color.m_data + 2))
          ;
          bVar19 = false;
        }
        if (iVar3 != 1) {
          reference_color.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(reference_color.m_data + 2));
          std::operator<<((ostream *)(reference_color.m_data + 2),
                          "Invalid data was sampled in tessellation evaluation shader stage.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&reference_color,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(reference_color.m_data + 2))
          ;
          bVar19 = false;
        }
        if (iVar4 != 1) {
          reference_color.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(reference_color.m_data + 2));
          std::operator<<((ostream *)(reference_color.m_data + 2),
                          "Invalid data was sampled in geometry shader stage.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&reference_color,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(reference_color.m_data + 2))
          ;
          bVar19 = false;
        }
        uVar20 = uVar20 + 1;
        piVar18 = piVar18 + 4;
      }
      (**(code **)(lVar9 + 0x1670))(0x8c8e);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x122a);
      puVar12 = (uchar *)operator_new__((ulong)(this->m_reference_texture_width *
                                                this->m_reference_texture_height * 4));
      this->m_result_data = puVar12;
      (**(code **)(lVar9 + 0xb8))(0xde1,this->m_result_to_id);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glBindTexture() call failed for GL_TEXTURE_2D texture target.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1231);
      (**(code **)(lVar9 + 0xaa0))(0xde1,0,0x1908,0x1401,this->m_result_data);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glGetTexImage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1234);
      bVar5 = true;
      uVar20 = 0;
      while ((uVar20 < this->m_reference_texture_height && (bVar5))) {
        uVar22 = this->m_reference_texture_width;
        iVar6 = (int)uVar20 * uVar22;
        puVar12 = this->m_result_data;
        uVar16 = 0;
        uVar21 = 0;
        while ((uVar21 < uVar22 && (bVar5))) {
          if ((puVar12[(ulong)uVar16 + (ulong)(uint)(iVar6 * 4)] != 0xff) ||
             (((puVar12[(ulong)uVar16 + (ulong)(uint)(iVar6 * 4) + 1] != 0xff ||
               (puVar12[(ulong)uVar16 + (ulong)(uint)(iVar6 * 4) + 2] != 0xff)) ||
              (puVar12[(ulong)uVar16 + (ulong)(uint)(iVar6 * 4) + 3] != 0xff)))) {
            reference_color.m_data._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::operator<<((ostream *)this_00,"Invalid data was sampled at (");
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::operator<<((ostream *)this_00,") in fragment shader stage.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&reference_color,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            uVar22 = this->m_reference_texture_width;
            bVar5 = false;
          }
          uVar21 = uVar21 + 1;
          uVar16 = uVar16 + 4;
        }
        uVar20 = uVar20 + 1;
      }
      if (!bVar5) {
        bVar19 = false;
      }
      if (this->m_result_data != (uchar *)0x0) {
        operator_delete__(this->m_result_data);
      }
      this->m_result_data = (uchar *)0x0;
      n_sample_00 = n_sample_00 + 1;
      GVar8 = this->m_iteration_view_texture_minlevel;
    }
    uVar20 = (ulong)(uVar14 + 1);
    uVar21 = (ulong)this->m_iteration_view_texture_minlayer;
  } while( true );
}

Assistant:

bool TextureViewTestViewSampling::executeTest()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Bind the view to zero texture unit */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	gl.bindTexture(m_iteration_view_texture_target, m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* Bind the buffer object to zero TF binding point */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Activate the test program */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Update draw framebuffer configuration so that the test's fragment shader draws
	 * to the result texture */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_result_to_id, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Allocate enough space to hold reference color data for all sample s*/
	float* reference_color_data = new float[m_iteration_parent_texture_n_samples * sizeof(float) * 4 /* rgba */];

	/* Iterate through the layer/face/mipmap hierarchy. For each iteration, we
	 * potentially need to update relevant uniforms controlling the sampling process
	 * the test program object performs.
	 */
	bool is_view_cm_cma = (m_iteration_view_texture_target == GL_TEXTURE_CUBE_MAP ||
						   m_iteration_view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

	for (unsigned int n_current_layer = m_iteration_view_texture_minlayer;
		 n_current_layer < (m_iteration_view_texture_minlayer + m_iteration_view_texture_numlayers) && result;
		 n_current_layer++)
	{
		unsigned int n_texture_face  = 0;
		unsigned int n_texture_layer = 0;
		unsigned int n_view_face	 = 0;
		unsigned int n_view_layer	= 0;

		if (is_view_cm_cma)
		{
			n_texture_face  = n_current_layer % 6;										 /* faces */
			n_texture_layer = n_current_layer / 6;										 /* faces */
			n_view_face		= (n_current_layer - m_iteration_view_texture_minlayer) % 6; /* faces */
			n_view_layer	= (n_current_layer - m_iteration_view_texture_minlayer) / 6; /* faces */
		}
		else
		{
			/* Only cube-map and cube-map array textures consist of faces. */
			n_texture_face  = 0;
			n_texture_layer = n_current_layer;
			n_view_face		= 0;
			n_view_layer	= n_current_layer;
		}

		if (m_po_z_float_location != -1)
		{
			float z = 0.0f;

			if (((false == is_view_cm_cma) && (m_iteration_view_texture_numlayers > 1)) ||
				((true == is_view_cm_cma) && (m_iteration_view_texture_numlayers > 6)))
			{
				if (is_view_cm_cma)
				{
					z = float(n_view_layer) / float(m_iteration_view_texture_numlayers / 6 - 1);
				}
				else
				{
					if (m_iteration_view_texture_numlayers > 1)
					{
						/* The program will be sampling a view so make sure that layer the shader accesses
						 * is relative to how our view was configured */
						z = float(n_view_layer - m_iteration_view_texture_minlayer) /
							float(m_iteration_view_texture_numlayers - 1);
					}
					else
					{
						/* z should stay at 0 */
					}
				}
			}
			else
			{
				/* z should stay at 0.0 */
			}

			gl.uniform1f(m_po_z_float_location, z);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");
		}

		if (m_po_z_int_location != -1)
		{
			DE_ASSERT(!is_view_cm_cma);

			gl.uniform1i(m_po_z_int_location, n_current_layer - m_iteration_view_texture_minlayer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
		}

		if (m_po_n_face_location != -1)
		{
			gl.uniform1i(m_po_n_face_location, n_view_face);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
		}

		for (unsigned int n_mipmap = m_iteration_view_texture_minlevel;
			 n_mipmap < (m_iteration_view_texture_minlevel + m_iteration_view_texture_numlevels) && result; n_mipmap++)
		{
			if (m_po_lod_location != -1)
			{
				/* The program will be sampling a view so make sure that LOD the shader accesses
				 * is relative to how our view was configured.
				 */
				gl.uniform1f(m_po_lod_location, (float)(n_mipmap - m_iteration_view_texture_minlevel));
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
			}

			/* Update local reference color data storage */
			for (unsigned int n_sample = 0; n_sample < m_iteration_parent_texture_n_samples; ++n_sample)
			{
				tcu::Vec4 reference_color = getReferenceColor(n_texture_layer, n_texture_face, n_mipmap, n_sample);

				reference_color_data[4 /* rgba */ * n_sample + 0] = reference_color.x();
				reference_color_data[4 /* rgba */ * n_sample + 1] = reference_color.y();
				reference_color_data[4 /* rgba */ * n_sample + 2] = reference_color.z();
				reference_color_data[4 /* rgba */ * n_sample + 3] = reference_color.w();
			}

			/* Upload it to GPU */
			gl.uniform4fv(m_po_reference_colors_location, m_iteration_parent_texture_n_samples, reference_color_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

			/* Bind the texture view to sample from */
			gl.bindTexture(m_iteration_view_texture_target, m_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			/* Draw a single patch. Given the rendering pipeline we've defined in the
			 * test program object, this should give us a nice full-screen quad, as well
			 * as 6*4 ints XFBed out, describing whether the view was sampled correctly.
			 */
			gl.beginTransformFeedback(GL_TRIANGLES);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
			{
				gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
			}
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

			/* In order to verify if the texel data was sampled correctly, we need to do two things:
			 *
			 * 1) Verify buffer object contents;
			 * 2) Make sure that all texels of current render-target are vec4(1).
			 *
			 */
			const int* bo_storage_ptr = (const int*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");
			if (bo_storage_ptr == NULL)
			{
				TCU_FAIL("glMapBuffer() call succeeded but the pointer returned is NULL");
			}

			/* The rendering pipeline should have written 6 vertices * 4 ints to the BO.
			 * The integers are set to 1 if the sampled texels were found valid, 0 otherwise,
			 * and are arranged in the following order:
			 *
			 * 1) Result of sampling in vertex shader stage;
			 * 2) Result of sampling in tessellation control shader stage;
			 * 3) Result of sampling in tessellation evaluation shader stage;
			 * 4) Result of sampling in geometry shader stage;
			 */
			for (unsigned int n_vertex = 0; n_vertex < 6 /* as per comment */ && result; ++n_vertex)
			{
				const int* vertex_data_ptr = bo_storage_ptr + n_vertex * 4 /* as per comment */;
				int		   vs_result	   = vertex_data_ptr[0];
				int		   tc_result	   = vertex_data_ptr[1];
				int		   te_result	   = vertex_data_ptr[2];
				int		   gs_result	   = vertex_data_ptr[3];

				if (vs_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled in vertex shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (tc_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid data was sampled in tessellation control shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (te_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid data was sampled in tessellation evaluation shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (gs_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled in geometry shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* for (all vertices) */

			/* Unmap the BO */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Read texels rendered by the fragment shader. The texture attached uses
			 * GL_RGBA8 internalformat.*/
			m_result_data = new unsigned char[m_reference_texture_width * m_reference_texture_height * 4 /* RGBA */];

			gl.bindTexture(GL_TEXTURE_2D, m_result_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed for GL_TEXTURE_2D texture target.");

			gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, GL_RGBA, GL_UNSIGNED_BYTE, m_result_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			/* The test fails if any of the fragments is not equal to vec4(1) */
			bool fs_result = true;

			for (unsigned int y = 0; y < m_reference_texture_height && fs_result; ++y)
			{
				const unsigned char* row_ptr = m_result_data + m_reference_texture_width * y * 4 /* RGBA */;

				for (unsigned int x = 0; x < m_reference_texture_width && fs_result; ++x)
				{
					const unsigned char* pixel_ptr = row_ptr + x * 4 /* RGBA */;

					if (pixel_ptr[0] != 255 || pixel_ptr[1] != 255 || pixel_ptr[2] != 255 || pixel_ptr[3] != 255)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled at (" << x << ", " << y
										   << ") "
											  "in fragment shader stage."
										   << tcu::TestLog::EndMessage;

						fs_result = false;
					}
				} /* for (all columns) */
			}	 /* for (all rows) */

			if (!fs_result)
			{
				result = false;
			}

			/* Done - we can release the buffer at this point */
			delete[] m_result_data;
			m_result_data = DE_NULL;
		} /* for (all mip-maps) */
	}	 /* for (all texture layers) */

	/* Release the reference color data buffer */
	delete[] reference_color_data;
	reference_color_data = DE_NULL;

	/* All done */
	return result;
}